

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aems.cpp
# Opt level: O3

void despot::AEMS::Backup(VNode *vnode)

{
  int iVar1;
  int iVar2;
  long *plVar3;
  log_ostream *plVar4;
  ostream *poVar5;
  QNode *qnode;
  double dVar6;
  
  iVar1 = logging::level();
  if ((0 < iVar1) && (iVar1 = logging::level(), 3 < iVar1)) {
    plVar4 = logging::stream(4);
    std::__ostream_insert<char,std::char_traits<char>>(&plVar4->super_ostream,"- Backup ",9);
    poVar5 = std::ostream::_M_insert<void_const*>(plVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," at depth ",10);
    iVar1 = VNode::depth(vnode);
    plVar3 = (long *)std::ostream::operator<<(poVar5,iVar1);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
  }
  iVar1 = 0;
  while( true ) {
    iVar2 = logging::level();
    if ((0 < iVar2) && (iVar2 = logging::level(), 3 < iVar2)) {
      plVar4 = logging::stream(4);
      std::__ostream_insert<char,std::char_traits<char>>(&plVar4->super_ostream," Iter ",6);
      poVar5 = (ostream *)std::ostream::operator<<(plVar4,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      poVar5 = std::ostream::_M_insert<void_const*>(poVar5);
      std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      iVar1 = iVar1 + 1;
    }
    Update(vnode);
    iVar2 = logging::level();
    if ((0 < iVar2) && (iVar2 = logging::level(), 3 < iVar2)) {
      plVar4 = logging::stream(4);
      std::__ostream_insert<char,std::char_traits<char>>
                (&plVar4->super_ostream," Updated vnode ",0xf);
      poVar5 = std::ostream::_M_insert<void_const*>(plVar4);
      std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
    }
    qnode = VNode::parent(vnode);
    if (qnode == (QNode *)0x0) break;
    Update(qnode);
    iVar2 = logging::level();
    if ((0 < iVar2) && (iVar2 = logging::level(), 3 < iVar2)) {
      plVar4 = logging::stream(4);
      std::__ostream_insert<char,std::char_traits<char>>
                (&plVar4->super_ostream," Updated Q-node to (",0x14);
      dVar6 = QNode::lower_bound(qnode);
      poVar5 = std::ostream::_M_insert<double>(dVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
      dVar6 = QNode::upper_bound(qnode);
      poVar5 = std::ostream::_M_insert<double>(dVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
      std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
    }
    vnode = QNode::parent(qnode);
  }
  iVar1 = logging::level();
  if ((0 < iVar1) && (iVar1 = logging::level(), 3 < iVar1)) {
    plVar4 = logging::stream(4);
    std::__ostream_insert<char,std::char_traits<char>>
              (&plVar4->super_ostream,"* Backup complete!",0x12);
    std::ios::widen((char)(plVar4->super_ostream)._vptr_basic_ostream[-3] + (char)plVar4);
    std::ostream::put((char)plVar4);
    std::ostream::flush();
    return;
  }
  return;
}

Assistant:

void AEMS::Backup(VNode* vnode) {
	int iter = 0;
	logd << "- Backup " << vnode << " at depth " << vnode->depth() << endl;
	while (true) {
		logd << " Iter " << (iter++) << " " << vnode << endl;

		Update(vnode);
		logd << " Updated vnode " << vnode << endl;

		QNode* parentq = vnode->parent();
		if (parentq == NULL)
			break;

		Update(parentq);
		logd << " Updated Q-node to (" << parentq->lower_bound() << ", "
			<< parentq->upper_bound() << ")" << endl;

		vnode = parentq->parent();
	}
	logd << "* Backup complete!" << endl;
}